

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcRoundedEdgeFeature::IfcRoundedEdgeFeature(IfcRoundedEdgeFeature *this)

{
  *(undefined ***)&this->field_0x198 = &PTR__Object_00806a70;
  *(undefined8 *)&this->field_0x1a0 = 0;
  *(char **)&this->field_0x1a8 = "IfcRoundedEdgeFeature";
  Schema_2x3::IfcEdgeFeature::IfcEdgeFeature
            (&this->super_IfcEdgeFeature,&PTR_construction_vtable_24__008afec8);
  *(undefined8 *)&(this->super_IfcEdgeFeature).field_0x180 = 0;
  *(undefined8 *)
   &(this->super_IfcEdgeFeature).super_IfcFeatureElementSubtraction.super_IfcFeatureElement.
    super_IfcElement.super_IfcProduct.super_IfcObject = 0x8afd48;
  *(undefined8 *)&this->field_0x198 = 0x8afeb0;
  *(undefined8 *)
   &(this->super_IfcEdgeFeature).super_IfcFeatureElementSubtraction.super_IfcFeatureElement.
    super_IfcElement.super_IfcProduct.super_IfcObject.field_0x88 = 0x8afd70;
  (this->super_IfcEdgeFeature).super_IfcFeatureElementSubtraction.super_IfcFeatureElement.
  super_IfcElement.super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x8afd98;
  *(undefined8 *)
   &(this->super_IfcEdgeFeature).super_IfcFeatureElementSubtraction.super_IfcFeatureElement.
    super_IfcElement.super_IfcProduct.super_IfcObject.field_0xd0 = 0x8afdc0;
  *(undefined8 *)
   &(this->super_IfcEdgeFeature).super_IfcFeatureElementSubtraction.super_IfcFeatureElement.
    super_IfcElement.super_IfcProduct.field_0x100 = 0x8afde8;
  *(undefined8 *)
   &(this->super_IfcEdgeFeature).super_IfcFeatureElementSubtraction.super_IfcFeatureElement.
    super_IfcElement.field_0x138 = 0x8afe10;
  *(undefined8 *)
   &(this->super_IfcEdgeFeature).super_IfcFeatureElementSubtraction.super_IfcFeatureElement.
    super_IfcElement.field_0x148 = 0x8afe38;
  *(undefined8 *)
   &(this->super_IfcEdgeFeature).super_IfcFeatureElementSubtraction.super_IfcFeatureElement.
    field_0x158 = 0x8afe60;
  *(undefined8 *)&(this->super_IfcEdgeFeature).field_0x178 = 0x8afe88;
  this->field_0x190 = 0;
  return;
}

Assistant:

IfcRoundedEdgeFeature() : Object("IfcRoundedEdgeFeature") {}